

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O1

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  mfcc_t *pmVar4;
  mfcc_t *pmVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (0 < nfr) {
    if (varnorm != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x9a,"Variance normalization not implemented in live mode decode\n");
      exit(1);
    }
    uVar6 = 0;
    do {
      pfVar3 = (float *)incep[uVar6];
      if (0.0 < *pfVar3 || *pfVar3 == 0.0) {
        iVar1 = cmn->veclen;
        if (0 < (long)iVar1) {
          pmVar4 = cmn->cmn_mean;
          pmVar5 = cmn->sum;
          lVar8 = 0;
          do {
            pmVar5[lVar8] = (mfcc_t)(pfVar3[lVar8] + (float)pmVar5[lVar8]);
            pfVar3[lVar8] = pfVar3[lVar8] - (float)pmVar4[lVar8];
            lVar8 = lVar8 + 1;
          } while (iVar1 != lVar8);
        }
        cmn->nframe = cmn->nframe + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nfr);
    if (800 < cmn->nframe) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x58,"Update from < ");
      if (0 < cmn->veclen) {
        lVar8 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < cmn->veclen);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
      iVar1 = cmn->nframe;
      iVar2 = cmn->veclen;
      lVar8 = (long)iVar2;
      if (0 < lVar8) {
        pmVar4 = cmn->cmn_mean;
        pmVar5 = cmn->sum;
        lVar7 = 0;
        do {
          pmVar4[lVar7] = (mfcc_t)((float)pmVar5[lVar7] / (float)iVar1);
          lVar7 = lVar7 + 1;
        } while (lVar8 != lVar7);
      }
      if (799 < iVar1) {
        if (0 < iVar2) {
          pmVar4 = cmn->sum;
          lVar7 = 0;
          do {
            pmVar4[lVar7] = (mfcc_t)((float)pmVar4[lVar7] * (1.0 / (float)iVar1) * 500.0);
            lVar7 = lVar7 + 1;
          } while (lVar8 != lVar7);
        }
        cmn->nframe = 500;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
              ,0x69,"Update to   < ");
      if (0 < cmn->veclen) {
        lVar8 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < cmn->veclen);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
      return;
    }
  }
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}